

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O3

StructDef * __thiscall flatbuffers::EnumDef::ReverseLookup(EnumDef *this,int enum_idx)

{
  pointer ppEVar1;
  
  if (this->is_union == false) {
    __assert_fail("is_union",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0xe0,"StructDef *flatbuffers::EnumDef::ReverseLookup(int)");
  }
  ppEVar1 = (this->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    ppEVar1 = ppEVar1 + 1;
    if (ppEVar1 ==
        (this->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return (StructDef *)0x0;
    }
  } while ((*ppEVar1)->value != enum_idx);
  return (*ppEVar1)->struct_def;
}

Assistant:

StructDef *ReverseLookup(int enum_idx) {
    assert(is_union);
    for (auto it = vals.vec.begin() + 1; it != vals.vec.end(); ++it) {
      if ((*it)->value == enum_idx) {
        return (*it)->struct_def;
      }
    }
    return nullptr;
  }